

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lalr.c
# Opt level: O3

void initialize_F(void)

{
  int iVar1;
  shifts *psVar2;
  int iVar3;
  Yshort **relation;
  char *__ptr;
  ulong uVar4;
  Yshort *pYVar5;
  char *pcVar6;
  uint *puVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  
  F = (uint *)allocate(ngotos * tokensetsize * 4);
  relation = (Yshort **)allocate(ngotos << 3);
  __ptr = allocate(ngotos * 4 + 4);
  if (0 < ngotos) {
    lVar8 = 0;
    puVar7 = F;
    do {
      pYVar5 = accessing_symbol;
      iVar10 = to_state[lVar8];
      psVar2 = shift_table[iVar10];
      if (psVar2 != (shifts *)0x0) {
        iVar1 = psVar2->nshifts;
        if ((long)iVar1 < 1) {
          uVar4 = 0;
LAB_0010d121:
          if ((int)uVar4 < iVar1) {
            uVar4 = uVar4 & 0xffffffff;
            uVar11 = 0;
            pYVar5 = accessing_symbol;
            pcVar6 = nullable;
            do {
              if (pcVar6[pYVar5[psVar2->shift[uVar4]]] != '\0') {
                iVar3 = map_goto(iVar10,pYVar5[psVar2->shift[uVar4]]);
                iVar9 = (int)uVar11;
                uVar11 = (ulong)(iVar9 + 1);
                *(int *)(__ptr + (long)iVar9 * 4) = iVar3;
                pYVar5 = accessing_symbol;
                pcVar6 = nullable;
              }
              uVar4 = uVar4 + 1;
            } while ((int)uVar4 < iVar1);
            iVar10 = (int)uVar11;
            if (iVar10 != 0) {
              pYVar5 = (Yshort *)allocate(iVar10 * 4 + 4);
              relation[lVar8] = pYVar5;
              if (0 < iVar10) {
                uVar4 = 0;
                do {
                  pYVar5[uVar4] = *(Yshort *)(__ptr + uVar4 * 4);
                  uVar4 = uVar4 + 1;
                } while (uVar11 != uVar4);
              }
              pYVar5[iVar10] = -1;
            }
          }
        }
        else {
          uVar4 = 0;
          do {
            iVar3 = pYVar5[psVar2->shift[uVar4]];
            if (start_symbol <= iVar3) goto LAB_0010d121;
            puVar7[iVar3 >> 5] = puVar7[iVar3 >> 5] | 1 << ((byte)iVar3 & 0x1f);
            uVar4 = uVar4 + 1;
          } while ((long)iVar1 != uVar4);
        }
      }
      puVar7 = puVar7 + tokensetsize;
      lVar8 = lVar8 + 1;
    } while (lVar8 < ngotos);
  }
  *(byte *)F = (byte)*F | 1;
  digraph(relation);
  lVar8 = (long)ngotos;
  if (0 < lVar8) {
    lVar12 = 0;
    do {
      if (relation[lVar12] != (Yshort *)0x0) {
        free(relation[lVar12]);
      }
      lVar12 = lVar12 + 1;
    } while (lVar8 != lVar12);
  }
  free(relation);
  free(__ptr);
  return;
}

Assistant:

void initialize_F()
{
  register int i;
  register int j;
  register int k;
  register shifts *sp;
  register Yshort *edge;
  register unsigned *rowp;
  register Yshort *rp;
  register Yshort **reads;
  register int nedges;
  register int stateno;
  register int symbol;
  register int nwords;

  nwords = ngotos * tokensetsize;
  F = NEW2(nwords, unsigned);

  reads = NEW2(ngotos, Yshort *);
  edge = NEW2(ngotos + 1, Yshort);
  nedges = 0;

  rowp = F;
  for (i = 0; i < ngotos; i++)
    {
      stateno = to_state[i];
      sp = shift_table[stateno];

      if (sp)
	{
	  k = sp->nshifts;

	  for (j = 0; j < k; j++)
	    {
	      symbol = accessing_symbol[sp->shift[j]];
	      if (ISVAR(symbol))
		break;
	      SETBIT(rowp, symbol);
	    }

	  for (; j < k; j++)
	    {
	      symbol = accessing_symbol[sp->shift[j]];
	      if (nullable[symbol])
		edge[nedges++] = map_goto(stateno, symbol);
	    }
	
	  if (nedges)
	    {
	      reads[i] = rp = NEW2(nedges + 1, Yshort);

	      for (j = 0; j < nedges; j++)
		rp[j] = edge[j];

	      rp[nedges] = -1;
	      nedges = 0;
	    }
	}

      rowp += tokensetsize;
    }

  SETBIT(F, 0);
  digraph(reads);

  for (i = 0; i < ngotos; i++)
    {
      if (reads[i])
	FREE(reads[i]);
    }

  FREE(reads);
  FREE(edge);
}